

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# internal_file_server.cpp
# Opt level: O2

long __thiscall cppcms::impl::file_server_detail::async_file_handler::go(async_file_handler *this)

{
  byte bVar1;
  int iVar2;
  response *prVar3;
  long extraout_RAX;
  undefined4 extraout_var;
  char *__buf;
  string local_30;
  
  bVar1 = (&this->field_0x30)[*(long *)(*(long *)&this->f + -0x18)];
  prVar3 = http::context::response
                     ((this->ctx).
                      super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  if ((bVar1 & 5) != 0) {
    http::response::set_html_header(prVar3);
    prVar3 = http::context::response
                       ((this->ctx).
                        super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                       );
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    local_30._M_string_length = 0;
    local_30.field_2._M_local_buf[0] = '\0';
    http::response::make_error_response(prVar3,0x194,&local_30);
    std::__cxx11::string::~string((string *)&local_30);
    http::context::async_complete_response
              ((this->ctx).super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr);
    return extraout_RAX;
  }
  http::response::full_asynchronous_buffering(prVar3,false);
  prVar3 = http::context::response
                     ((this->ctx).
                      super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  http::response::out(prVar3);
  prVar3 = http::context::response
                     ((this->ctx).
                      super___shared_ptr<cppcms::http::context,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
  http::response::setbuf(prVar3,(FILE *)0x0,__buf);
  iVar2 = (*(this->super_callable<void_(cppcms::http::context::completion_type)>).super_refcounted.
            _vptr_refcounted[2])(this,0);
  return CONCAT44(extraout_var,iVar2);
}

Assistant:

void go()
	{
		if(!f) {
			ctx->response().set_html_header();
			ctx->response().make_error_response(404);
			ctx->async_complete_response();
		}
		else {
			ctx->response().full_asynchronous_buffering(false);
			ctx->response().out();
			ctx->response().setbuf(0);
			(*this)(cppcms::http::context::operation_completed);
		}
		
	}